

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

void write_utf8(charset_spec_conflict *charset,long input_chr,charset_state *state,
               _func_void_void_ptr_long *emit,void *emitctx)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  void *emitctx_local;
  _func_void_void_ptr_long *emit_local;
  charset_state *state_local;
  long input_chr_local;
  charset_spec_conflict *charset_local;
  
  if (((input_chr == 0xfffe) || (input_chr == 0xffff)) ||
     ((0xd7ff < input_chr && (input_chr < 0xe000)))) {
    (*emit)(emitctx,0xffff);
  }
  else if (input_chr < 0x80) {
    (*emit)(emitctx,input_chr);
  }
  else {
    uVar1 = input_chr >> 6;
    if (input_chr < 0x800) {
      (*emit)(emitctx,uVar1 & 0x1f | 0xc0);
      (*emit)(emitctx,input_chr & 0x3fU | 0x80);
    }
    else {
      uVar2 = input_chr >> 0xc;
      if (input_chr < 0x10000) {
        (*emit)(emitctx,uVar2 & 0xf | 0xe0);
        (*emit)(emitctx,uVar1 & 0x3f | 0x80);
        (*emit)(emitctx,input_chr & 0x3fU | 0x80);
      }
      else {
        uVar3 = input_chr >> 0x12;
        if (input_chr < 0x200000) {
          (*emit)(emitctx,uVar3 & 7 | 0xf0);
          (*emit)(emitctx,uVar2 & 0x3f | 0x80);
          (*emit)(emitctx,uVar1 & 0x3f | 0x80);
          (*emit)(emitctx,input_chr & 0x3fU | 0x80);
        }
        else if (input_chr < 0x4000000) {
          (*emit)(emitctx,input_chr >> 0x18 & 3U | 0xf8);
          (*emit)(emitctx,uVar3 & 0x3f | 0x80);
          (*emit)(emitctx,uVar2 & 0x3f | 0x80);
          (*emit)(emitctx,uVar1 & 0x3f | 0x80);
          (*emit)(emitctx,input_chr & 0x3fU | 0x80);
        }
        else {
          (*emit)(emitctx,input_chr >> 0x1e & 1U | 0xfc);
          (*emit)(emitctx,input_chr >> 0x18 & 0x3fU | 0x80);
          (*emit)(emitctx,uVar3 & 0x3f | 0x80);
          (*emit)(emitctx,uVar2 & 0x3f | 0x80);
          (*emit)(emitctx,uVar1 & 0x3f | 0x80);
          (*emit)(emitctx,input_chr & 0x3fU | 0x80);
        }
      }
    }
  }
  return;
}

Assistant:

static void write_utf8(charset_spec const *charset, long int input_chr,
                       charset_state *state,
                       void (*emit)(void *ctx, long int output), void *emitctx)
{
    UNUSEDARG(charset);
    UNUSEDARG(state);

    /*
     * Refuse to output any illegal code points.
     */
    if (input_chr == 0xFFFE || input_chr == 0xFFFF ||
        (input_chr >= 0xD800 && input_chr < 0xE000)) {
        emit(emitctx, ERROR);
    } else if (input_chr < 0x80) {     /* one-byte character */
        emit(emitctx, input_chr);
    } else if (input_chr < 0x800) {    /* two-byte character */
        emit(emitctx, 0xC0 | (0x1F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else if (input_chr < 0x10000) {  /* three-byte character */
        emit(emitctx, 0xE0 | (0x0F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else if (input_chr < 0x200000) { /* four-byte character */
        emit(emitctx, 0xF0 | (0x07 & (input_chr >> 18)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else if (input_chr < 0x4000000) {/* five-byte character */
        emit(emitctx, 0xF8 | (0x03 & (input_chr >> 24)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 18)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    } else {                           /* six-byte character */
        emit(emitctx, 0xFC | (0x01 & (input_chr >> 30)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 24)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 18)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >> 12)));
        emit(emitctx, 0x80 | (0x3F & (input_chr >>  6)));
        emit(emitctx, 0x80 | (0x3F & (input_chr      )));
    }
}